

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_mgr.cxx
# Opt level: O2

bool nuraft::raft_server::get_stat_histogram
               (string *name,
               map<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
               *histogram_out)

{
  bool bVar1;
  stat_elem *psVar2;
  HistItr *entry;
  iterator __begin1;
  ulong local_38;
  int local_30;
  undefined4 uStack_2c;
  long local_28;
  pair<unsigned_long,_unsigned_long> local_20;
  
  stat_mgr::get_instance();
  psVar2 = stat_mgr::get_stat(&stat_mgr::get_instance::mgr_instance,name);
  if ((psVar2 == (stat_elem *)0x0) || (psVar2->stat_type_ != HISTOGRAM)) {
    bVar1 = false;
  }
  else {
    Histogram::begin(psVar2->hist_);
    while (local_38 != 0x41) {
      local_20.second = *(unsigned_long *)(*(long *)(local_28 + 0x10) + local_38 * 8);
      if (local_20.second != 0) {
        local_20.first =
             -(ulong)(local_38 == 0) | 1L << ((ulong)(~(uint)local_38 + local_30) & 0x3f);
        std::
        _Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
        ::_M_emplace_unique<std::pair<unsigned_long,unsigned_long>>
                  ((_Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                    *)histogram_out,&local_20);
      }
      local_38 = local_38 + 1;
      if (CONCAT44(uStack_2c,local_30) <= local_38) {
        local_38 = CONCAT44(uStack_2c,local_30);
      }
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool raft_server::get_stat_histogram(const std::string& name,
                                     std::map<double, uint64_t>& histogram_out ) {
    stat_elem* elem = stat_mgr::get_instance()->get_stat(name);
    if (!elem) return false;
    if (elem->get_type() != stat_elem::HISTOGRAM) return false;

    for (HistItr& entry: *elem->get_histogram()) {
        uint64_t cnt = entry.getCount();
        if (cnt) {
            histogram_out.insert( std::make_pair(entry.getUpperBound(), cnt) );
        }
    }
    return true;
}